

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O3

void __thiscall
pbrt::
HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
::Grow(HashMap<int,_int,_std::hash<int>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
       *this)

{
  size_t sVar1;
  optional<std::pair<int,_int>_> *poVar2;
  size_t sVar3;
  int nProbes;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  newTable;
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  vStack_48;
  polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_> local_28;
  aligned_storage_t<sizeof(std::pair<int,_int>),_alignof(std::pair<int,_int>)> local_20;
  undefined4 local_18;
  
  sVar1 = (this->table).nStored;
  local_28.memoryResource = (this->table).alloc.memoryResource;
  local_18 = 0;
  local_20 = (aligned_storage_t<sizeof(std::pair<int,_int>),_alignof(std::pair<int,_int>)>)0x0;
  sVar3 = 0x40;
  if (0x40 < sVar1 * 2) {
    sVar3 = sVar1 * 2;
  }
  pstd::
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  ::vector(&vStack_48,sVar3,(optional<std::pair<int,_int>_> *)&local_20.__align,&local_28);
  if (sVar1 != 0) {
    sVar3 = 0;
    do {
      poVar2 = (this->table).ptr;
      if (poVar2[sVar3].set == true) {
        poVar2 = poVar2 + sVar3;
        uVar5 = 0;
        do {
          iVar4 = (int)uVar5;
          uVar6 = uVar5 >> 1;
          uVar5 = (ulong)(iVar4 + 1);
          uVar6 = (ulong)((uint)(iVar4 * iVar4) >> 1) +
                  uVar6 + ((long)(int)(poVar2->optionalValue).__align & vStack_48.nStored - 1) &
                  vStack_48.nStored - 1;
        } while (vStack_48.ptr[uVar6].set != false);
        vStack_48.ptr[uVar6].optionalValue = poVar2->optionalValue;
        vStack_48.ptr[uVar6].set = true;
      }
      sVar3 = sVar3 + 1;
    } while (sVar3 != sVar1);
  }
  pstd::
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  ::operator=(&this->table,&vStack_48);
  pstd::
  vector<pstd::optional<std::pair<int,_int>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_int>_>_>_>
  ::~vector(&vStack_48);
  return;
}

Assistant:

void Grow() {
        size_t currentCapacity = capacity();
        pstd::vector<TableEntry> newTable(std::max<size_t>(64, 2 * currentCapacity),
                                          table.get_allocator());
        size_t newCapacity = newTable.size();
        for (size_t i = 0; i < currentCapacity; ++i) {
            // Insert _table[i]_ into _newTable_ if it is set
            if (!table[i].has_value())
                continue;
            size_t baseOffset = Hash()(table[i]->first) & (newCapacity - 1);
            for (int nProbes = 0;; ++nProbes) {
                size_t offset = (baseOffset + nProbes / 2 + nProbes * nProbes / 2) &
                                (newCapacity - 1);
                if (!newTable[offset]) {
                    newTable[offset] = std::move(*table[i]);
                    break;
                }
            }
        }
        table = std::move(newTable);
    }